

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall spvtools::opt::Module::HasExplicitCapability(Module *this,uint32_t cap)

{
  Instruction *this_00;
  bool bVar1;
  uint32_t uVar2;
  
  this_00 = (this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  while ((bVar1 = this_00 !=
                  &(this->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_,
         bVar1 && (uVar2 = Instruction::GetSingleWordOperand(this_00,0), uVar2 != cap))) {
    this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  return bVar1;
}

Assistant:

bool Module::HasExplicitCapability(uint32_t cap) {
  for (auto& ci : capabilities_) {
    uint32_t tcap = ci.GetSingleWordOperand(0);
    if (tcap == cap) {
      return true;
    }
  }
  return false;
}